

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::clear_to_size(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *this,size_type new_num_buckets)

{
  pointer table_start;
  
  table_start = this->table;
  if (table_start == (pointer)0x0) {
    table_start = Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>::allocate
                            ((Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> *)
                             &this->val_info,new_num_buckets,(const_pointer)0x0);
    this->table = table_start;
  }
  else if (this->num_buckets != new_num_buckets) {
    resize_table(this,this->num_buckets,new_num_buckets);
    table_start = this->table;
  }
  fill_range_with_empty(this,table_start,new_num_buckets);
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = new_num_buckets;
  sparsehash_internal::
  sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4> *)this
             ,new_num_buckets);
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }